

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O0

void __thiscall
Deque<int,std::allocator<int>>::copy<std::allocator<int>>
          (Deque<int,_std::allocator<int>_> *this,Deque<int,_std::allocator<int>_> *other)

{
  DataBlock *pDVar1;
  DataBlock **ppDVar2;
  DataBlock *pDVar3;
  int *piVar4;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  *pRVar5;
  DataBlock **ppDVar6;
  DataBlock *pDVar7;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  *in_RSI;
  new_allocator<int> *in_RDI;
  pointer ptr;
  long endOffset;
  long beginOffset;
  DataBlock *block;
  size_type i;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  *val;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  *this_00;
  int *__last;
  int *local_18;
  
  local_18 = (int *)0x0;
  while( true ) {
    __last = local_18;
    piVar4 = (int *)RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
                    ::size(in_RSI);
    if (__last == piVar4) break;
    pRVar5 = (RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
              *)operator_new(0x18);
    this_00 = pRVar5;
    ppDVar6 = RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
              ::operator[](in_RSI,(size_t)local_18);
    Deque<int,_std::allocator<int>_>::DataBlock::DataBlock((DataBlock *)this_00,*ppDVar6);
    ppDVar6 = pRVar5->arr_;
    pDVar1 = *(DataBlock **)pRVar5;
    ppDVar2 = pRVar5->begin_;
    pDVar3 = *(DataBlock **)pRVar5;
    val = pRVar5;
    pDVar7 = (DataBlock *)__gnu_cxx::new_allocator<int>::allocate(in_RDI,(size_type)__last,this_00);
    std::copy<int*,int*>((int *)in_RDI,__last,(int *)this_00);
    pRVar5->arr_ = (DataBlock **)((long)&pDVar7->buffer + ((long)ppDVar6 - (long)pDVar1 >> 2) * 4);
    pRVar5->begin_ = (DataBlock **)((long)&pDVar7->buffer + ((long)ppDVar2 - (long)pDVar3 >> 2) * 4)
    ;
    *(DataBlock **)pRVar5 = pDVar7;
    RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
    ::push_back(this_00,(DataBlock **)val);
    RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
    ::push_back(this_00,(DataBlock **)val);
    RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
    ::push_back(this_00,(DataBlock **)val);
    local_18 = (int *)((long)local_18 + 1);
  }
  return;
}

Assistant:

void copy(const Deque<T, Alloc2> &other) {
        for (size_type i = 0; i != other.current_.size(); ++i) {
            DataBlock *block = new DataBlock(*other.current_[i]);
            auto beginOffset = block->begin - block->buffer;
            auto endOffset = block->end - block->buffer;

            pointer ptr = allocator_.allocate(DataBlock::SIZE);
            std::copy(block->begin, block->end, ptr + beginOffset);
            block->begin = ptr + beginOffset;
            block->end = ptr + endOffset;
            block->buffer = ptr;

            small_.push_back(block);
            current_.push_back(block);
            big_.push_back(block);
        }
    }